

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  u8 *unaff_R15;
  
  uVar6 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar9 = uVar6 + 1;
  uVar8 = (uint)(ushort)(*(ushort *)(puVar2 + uVar6 + 1) << 8 | *(ushort *)(puVar2 + uVar6 + 1) >> 8
                        );
  uVar1 = pPg->pBt->usableSize;
  do {
    if (((int)(uVar1 - 4) < (int)uVar8) || (uVar8 < (int)uVar9 + 4U)) {
      uVar7 = 0xee77;
LAB_0021c172:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar7,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      *pRc = 0xb;
LAB_0021c18b:
      unaff_R15 = (u8 *)0x0;
      bVar3 = false;
    }
    else {
      uVar4 = *(ushort *)(puVar2 + (ulong)uVar8 + 2) << 8 |
              *(ushort *)(puVar2 + (ulong)uVar8 + 2) >> 8;
      iVar5 = (uint)uVar4 - nByte;
      if (iVar5 < 0) {
        bVar3 = true;
        uVar9 = (ulong)uVar8;
        uVar8 = (uint)(ushort)(*(ushort *)(puVar2 + uVar8) << 8 | *(ushort *)(puVar2 + uVar8) >> 8);
      }
      else {
        if ((uVar8 < (uint)pPg->cellOffset + (uint)pPg->nCell * 2) ||
           ((int)uVar1 < (int)(uVar4 + uVar8))) {
          uVar7 = 0xee82;
          goto LAB_0021c172;
        }
        if (iVar5 < 4) {
          if (0x39 < puVar2[uVar6 + 7]) goto LAB_0021c18b;
          *(undefined2 *)(puVar2 + uVar9) = *(undefined2 *)(puVar2 + uVar8);
          puVar2[uVar6 + 7] = puVar2[uVar6 + 7] + (char)iVar5;
        }
        else {
          *(ushort *)(puVar2 + (ulong)uVar8 + 2) = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
        }
        unaff_R15 = puVar2 + (iVar5 + uVar8);
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return unaff_R15;
    }
    if (uVar8 == 0) {
      return (u8 *)0x0;
    }
  } while( true );
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;

  assert( pc>0 );
  do{
    int size;            /* Size of the free slot */
    /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
    ** increasing offset. */
    if( pc>usableSize-4 || pc<iAddr+4 ){
      *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
      return 0;
    }
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( pc < pPg->cellOffset+2*pPg->nCell || size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
  }while( pc );

  return 0;
}